

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

int xmlGetThreadId(void)

{
  pthread_t pVar1;
  undefined4 uStack_10;
  int ret;
  pthread_t id;
  
  pVar1 = pthread_self();
  uStack_10 = (int)pVar1;
  return uStack_10;
}

Assistant:

int
xmlGetThreadId(void)
{
#ifdef HAVE_POSIX_THREADS
    pthread_t id;
    int ret;

    id = pthread_self();
    /* horrible but preserves compat, see warning above */
    memcpy(&ret, &id, sizeof(ret));
    return (ret);
#elif defined HAVE_WIN32_THREADS
    return GetCurrentThreadId();
#else
    return ((int) 0);
#endif
}